

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Int_t * Gia_ManSortCoBySuppSize(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  word *pData;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __size;
  
  iVar5 = p->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar3 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    p_00->pArray = (int *)0x0;
    pData = (word *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 * 4);
    p_00->pArray = piVar2;
    pData = (word *)malloc((long)iVar3 << 3);
  }
  if (vSupps->nSize < 1) {
    Abc_QuickSort3(pData,0,1);
    if (pData == (word *)0x0) {
      return p_00;
    }
  }
  else {
    iVar5 = 0;
    __size = 0;
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      iVar1 = *(int *)((long)&vSupps->pArray->nSize + __size);
      if ((int)uVar6 == iVar3) {
        if (uVar6 < 0x10) {
          if (pData == (word *)0x0) {
            pData = (word *)malloc(0x80);
          }
          else {
            pData = (word *)realloc(pData,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = iVar5;
          if (pData == (word *)0x0) {
            pData = (word *)malloc(__size);
          }
          else {
            pData = (word *)realloc(pData,__size);
          }
        }
        if (pData == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
      }
      pData[uVar6] = (long)iVar1 | uVar4;
      uVar7 = uVar6 + 1;
      uVar4 = uVar4 + 0x100000000;
      __size = __size + 0x10;
      iVar5 = iVar5 + 2;
    } while ((long)uVar7 < (long)vSupps->nSize);
    Abc_QuickSort3(pData,(int)uVar7,1);
    uVar7 = 0xffffffffffffffff;
    do {
      Vec_IntPush(p_00,*(int *)((long)pData + uVar7 * 8 + 0xc));
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  free(pData);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSortCoBySuppSize( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Vec_Int_t * vOrder = Vec_IntAlloc( Gia_ManCoNum(p) );
    Vec_Wrd_t * vSortData = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Vec_Int_t * vSuppOne; word Entry; int i;
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_WrdPush( vSortData, ((word)i << 32) | Vec_IntSize(vSuppOne) );
    Abc_QuickSort3( Vec_WrdArray(vSortData), Vec_WrdSize(vSortData), 1 );
    Vec_WrdForEachEntry( vSortData, Entry, i )
        Vec_IntPush( vOrder, (int)(Entry >> 32) );
    Vec_WrdFree( vSortData );
    return vOrder;
}